

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O3

void LogAllAvailableFormats(snd_pcm_t *pcm)

{
  long lVar1;
  size_t __n;
  undefined1 *__s;
  undefined8 uStack_20;
  
  uStack_20 = 0x11136b;
  __n = snd_pcm_hw_params_sizeof();
  lVar1 = -(__n + 0xf & 0xfffffffffffffff0);
  __s = &stack0xffffffffffffffe8 + lVar1;
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x111389;
  memset(__s,0,__n);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x111394;
  snd_pcm_hw_params_any(pcm,__s);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x1113a1;
  snd_pcm_hw_params_test_format(pcm,__s,0);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x1113b1;
  snd_pcm_hw_params_test_format(pcm,__s,1);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x1113c1;
  snd_pcm_hw_params_test_format(pcm,__s,2);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x1113d1;
  snd_pcm_hw_params_test_format(pcm,__s,3);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x1113e1;
  snd_pcm_hw_params_test_format(pcm,__s,4);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x1113f1;
  snd_pcm_hw_params_test_format(pcm,__s,5);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x111401;
  snd_pcm_hw_params_test_format(pcm,__s,6);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x111411;
  snd_pcm_hw_params_test_format(pcm,__s,7);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x111421;
  snd_pcm_hw_params_test_format(pcm,__s,8);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x111431;
  snd_pcm_hw_params_test_format(pcm,__s,9);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x111441;
  snd_pcm_hw_params_test_format(pcm,__s,0xe);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x111451;
  snd_pcm_hw_params_test_format(pcm,__s,0xf);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x111461;
  snd_pcm_hw_params_test_format(pcm,__s,0x10);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x111471;
  snd_pcm_hw_params_test_format(pcm,__s,0x11);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x111481;
  snd_pcm_hw_params_test_format(pcm,__s,0x12);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x111491;
  snd_pcm_hw_params_test_format(pcm,__s,0x13);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x1114a1;
  snd_pcm_hw_params_test_format(pcm,__s,0x14);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x1114b1;
  snd_pcm_hw_params_test_format(pcm,__s,0x15);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x1114c1;
  snd_pcm_hw_params_test_format(pcm,__s,0x16);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x1114d1;
  snd_pcm_hw_params_test_format(pcm,__s,0x17);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x1114e1;
  snd_pcm_hw_params_test_format(pcm,__s,0x18);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x1114f1;
  snd_pcm_hw_params_test_format(pcm,__s,0x1f);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x111501;
  snd_pcm_hw_params_test_format(pcm,__s,0x20);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x111511;
  snd_pcm_hw_params_test_format(pcm,__s,0x21);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x111521;
  snd_pcm_hw_params_test_format(pcm,__s,0x22);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x111531;
  snd_pcm_hw_params_test_format(pcm,__s,0x23);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x111541;
  snd_pcm_hw_params_test_format(pcm,__s,0x24);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x111551;
  snd_pcm_hw_params_test_format(pcm,__s,0x25);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x111561;
  snd_pcm_hw_params_test_format(pcm,__s,0x26);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x111571;
  snd_pcm_hw_params_test_format(pcm,__s,0x27);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x111581;
  snd_pcm_hw_params_test_format(pcm,__s,0x28);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x111591;
  snd_pcm_hw_params_test_format(pcm,__s,0x29);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x1115a1;
  snd_pcm_hw_params_test_format(pcm,__s,0x2a);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x1115b1;
  snd_pcm_hw_params_test_format(pcm,__s,0x2b);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x1115c1;
  snd_pcm_hw_params_test_format(pcm,__s,2);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x1115d1;
  snd_pcm_hw_params_test_format(pcm,__s,4);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x1115e1;
  snd_pcm_hw_params_test_format(pcm,__s,6);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x1115f1;
  snd_pcm_hw_params_test_format(pcm,__s,8);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x111601;
  snd_pcm_hw_params_test_format(pcm,__s,10);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x111611;
  snd_pcm_hw_params_test_format(pcm,__s,0xc);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x111621;
  snd_pcm_hw_params_test_format(pcm,__s,0xe);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x111631;
  snd_pcm_hw_params_test_format(pcm,__s,0x10);
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x111641;
  snd_pcm_hw_params_test_format(pcm,__s,0x12);
  return;
}

Assistant:

static void LogAllAvailableFormats( snd_pcm_t *pcm )
{
    PaSampleFormat available = 0;
    snd_pcm_hw_params_t *hwParams;
    alsa_snd_pcm_hw_params_alloca( &hwParams );

    alsa_snd_pcm_hw_params_any( pcm, hwParams );

    PA_DEBUG(( " --- Supported Formats ---\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S8 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S8\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U8 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U8\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S16_LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S16_LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S16_BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S16_BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U16_LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U16_LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U16_BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U16_BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S24_LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S24_LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S24_BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S24_BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U24_LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U24_LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U24_BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U24_BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_FLOAT_LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_FLOAT_LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_FLOAT_BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_FLOAT_BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_FLOAT64_LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_FLOAT64_LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_FLOAT64_BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_FLOAT64_BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_IEC958_SUBFRAME_LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_IEC958_SUBFRAME_LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_IEC958_SUBFRAME_BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_IEC958_SUBFRAME_BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_MU_LAW ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_MU_LAW\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_A_LAW ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_A_LAW\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_IMA_ADPCM ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_IMA_ADPCM\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_MPEG ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_MPEG\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_GSM ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_GSM\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_SPECIAL ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_SPECIAL\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S24_3LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S24_3LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S24_3BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S24_3BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U24_3LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U24_3LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U24_3BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U24_3BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S20_3LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S20_3LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S20_3BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S20_3BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U20_3LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U20_3LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U20_3BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U20_3BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S18_3LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S18_3LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S18_3BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S18_3BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U18_3LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U18_3LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U18_3BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U18_3BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S16 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S16\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U16 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U16\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S24 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S24\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U24 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U24\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S32 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S32\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U32 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U32\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_FLOAT ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_FLOAT\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_FLOAT64 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_FLOAT64\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_IEC958_SUBFRAME ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_IEC958_SUBFRAME\n" ));

    PA_DEBUG(( " -------------------------\n" ));
}